

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O1

int ssw2mcpl2(char *sswfile,char *mcplfile,int opt_dp,int opt_surf,int opt_gzip,char *inputdeckfile)

{
  int iVar1;
  ssw_file_t ff;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ssw_particle_t *psVar8;
  ulong __size;
  uint64_t cfgfile_lbuf;
  mcpl_particle_t mcpl_particle;
  undefined4 local_a0 [2];
  char *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  
  ff = ssw_open_file(sswfile);
  uVar2 = mcpl_create_outfile(mcplfile);
  pcVar3 = ssw_mcnpflavour(ff);
  mcpl_hdr_set_srcname(uVar2,pcVar3);
  pcVar3 = ssw_srcname(ff);
  sVar4 = strlen(pcVar3);
  pcVar3 = ssw_srcversion(ff);
  sVar5 = strlen(pcVar3);
  pcVar3 = ssw_title(ff);
  sVar6 = strlen(pcVar3);
  __size = sVar5 + sVar4 + sVar6 + 0x400;
  if (__size < 0x1000) {
    pcVar3 = (char *)malloc(__size);
    if (pcVar3 == (char *)0x0) {
      ssw_error("memory allocation failure");
    }
    *pcVar3 = '\0';
    ssw_strcat(pcVar3,"SSW file from ",__size);
    pcVar7 = ssw_mcnpflavour(ff);
    ssw_strcat(pcVar3,pcVar7,__size);
    ssw_strcat(pcVar3," converted with ssw2mcpl",__size);
    mcpl_hdr_add_comment(uVar2,pcVar3);
    *pcVar3 = '\0';
    ssw_strcat(pcVar3,"SSW metadata: [kods=\'",__size);
    pcVar7 = ssw_srcname(ff);
    ssw_strcat(pcVar3,pcVar7,__size);
    ssw_strcat(pcVar3,"\', vers=\'",__size);
    pcVar7 = ssw_srcversion(ff);
    ssw_strcat(pcVar3,pcVar7,__size);
    ssw_strcat(pcVar3,"\', title=\'",__size);
    pcVar7 = ssw_title(ff);
    ssw_strcat(pcVar3,pcVar7,__size);
    ssw_strcat(pcVar3,"\']",__size);
    mcpl_hdr_add_comment(uVar2,pcVar3);
    free(pcVar3);
  }
  else {
    mcpl_hdr_add_comment(uVar2,"SSW metadata: <too long so not stored>");
  }
  if (opt_surf != 0) {
    mcpl_hdr_add_comment
              (uVar2,"The userflags in this file are the surface IDs found in the SSW file");
    mcpl_enable_userflags(uVar2);
  }
  if (opt_dp != 0) {
    mcpl_enable_doubleprec(uVar2);
  }
  if (inputdeckfile != (char *)0x0) {
    mcpl_read_file_to_buffer(inputdeckfile,0x6400000,1,local_a0,&local_98);
    pcVar3 = local_98;
    pcVar7 = ssw_title(ff);
    pcVar3 = strstr(pcVar3,pcVar7);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = ssw_title(ff);
      printf("Error: specified configuration file %s does not contain title found in ssw file: \"%s\".\n"
             ,inputdeckfile,pcVar3);
      return 0;
    }
    mcpl_hdr_add_data(uVar2,"mcnp_input_deck",local_a0[0],local_98);
    free(local_98);
  }
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = (char *)0x0;
  uStack_90 = 0;
  local_38 = 0;
  do {
    psVar8 = ssw_load_particle(ff);
    if (psVar8 == (ssw_particle_t *)0x0) break;
    iVar1 = (int)psVar8->pdgcode;
    local_38 = CONCAT44(local_38._4_4_,iVar1);
    if (iVar1 == 0) {
      printf("Warning: ignored particle with no PDG code set (raw ssw type was %li).\n",
             psVar8->rawtype);
    }
    else {
      local_78 = psVar8->x;
      dStack_70 = psVar8->y;
      local_68 = psVar8->z;
      dStack_60 = psVar8->dirx;
      local_58 = psVar8->diry;
      dStack_50 = psVar8->dirz;
      local_48 = psVar8->time * 1e-05;
      dStack_40 = psVar8->weight;
      local_98 = (char *)psVar8->ekin;
      local_38 = CONCAT44((int)psVar8->isurf,iVar1);
      mcpl_add_particle(uVar2,&local_98);
    }
  } while (psVar8 != (ssw_particle_t *)0x0);
  pcVar3 = (char *)mcpl_outfile_filename(uVar2);
  sVar4 = strlen(pcVar3);
  pcVar7 = (char *)malloc(sVar4 + 1);
  if (pcVar7 == (char *)0x0) {
    ssw_error("memory allocation failure");
  }
  *pcVar7 = '\0';
  ssw_strcat(pcVar7,pcVar3,sVar4 + 1);
  if (opt_gzip == 0) {
    mcpl_close_outfile(uVar2);
    pcVar3 = "";
  }
  else {
    iVar1 = mcpl_closeandgzip_outfile(uVar2);
    pcVar3 = ".gz";
    if (iVar1 == 0) {
      pcVar3 = "";
    }
  }
  ssw_close_file(ff);
  printf("Created %s%s\n",pcVar7,pcVar3);
  free(pcVar7);
  return 1;
}

Assistant:

int ssw2mcpl2(const char * sswfile, const char * mcplfile,
              int opt_dp, int opt_surf, int opt_gzip,
              const char * inputdeckfile)
{
  ssw_file_t f = ssw_open_file(sswfile);
  mcpl_outfile_t mcplfh = mcpl_create_outfile(mcplfile);
  mcpl_hdr_set_srcname(mcplfh,ssw_mcnpflavour(f));

  size_t lstrbuf = 1024;
  lstrbuf += strlen(ssw_srcname(f));
  lstrbuf += strlen(ssw_srcversion(f));
  lstrbuf += strlen(ssw_title(f));
  if (lstrbuf<4096) {
    char * buf = (char*)malloc(lstrbuf);
    if (!buf)
      ssw_error("memory allocation failure");
    buf[0] = '\0';
    ssw_strcat(buf,"SSW file from ",lstrbuf);
    ssw_strcat(buf,ssw_mcnpflavour(f),lstrbuf);
    ssw_strcat(buf," converted with ssw2mcpl",lstrbuf);
    mcpl_hdr_add_comment(mcplfh,buf);

    buf[0] = '\0';
    ssw_strcat(buf,"SSW metadata: [kods='",lstrbuf);
    ssw_strcat(buf,ssw_srcname(f),lstrbuf);
    ssw_strcat(buf,"', vers='",lstrbuf);
    ssw_strcat(buf,ssw_srcversion(f),lstrbuf);
    ssw_strcat(buf,"', title='",lstrbuf);
    ssw_strcat(buf,ssw_title(f),lstrbuf);
    ssw_strcat(buf,"']",lstrbuf);
    mcpl_hdr_add_comment(mcplfh,buf);
    free(buf);
  } else {
    mcpl_hdr_add_comment(mcplfh,"SSW metadata: <too long so not stored>");
  }
  if (opt_surf) {
    mcpl_hdr_add_comment(mcplfh,"The userflags in this file are the surface IDs found in the SSW file");
    mcpl_enable_userflags(mcplfh);
  }
  if (opt_dp) {
    mcpl_enable_doubleprec(mcplfh);
  }

  if (inputdeckfile) {
    char* cfgfile_buf;
    uint64_t cfgfile_lbuf;
    mcpl_read_file_to_buffer( inputdeckfile,
                              104857600,//100mb is beyond enough and within than
                                        //32bit integer reach.
                              1,//must be text
                              &cfgfile_lbuf,
                              &cfgfile_buf );
    /* if (!sswmcpl_file2buf(inputdeckfile, &cfgfile_buf, &cfgfile_lbuf, 104857600, 1)) */
    /*   return 0; */
    if (!strstr((const char*)cfgfile_buf, ssw_title(f))) {
      printf("Error: specified configuration file %s does not contain title"
             " found in ssw file: \"%s\".\n",inputdeckfile,ssw_title(f));
      return 0;
    }
    mcpl_hdr_add_data(mcplfh, "mcnp_input_deck",
                      (uint32_t)cfgfile_lbuf,
                      cfgfile_buf);
    free(cfgfile_buf);
  }

  mcpl_particle_t mcpl_particle;
  memset(&mcpl_particle,0,sizeof(mcpl_particle));

  while ( 1 ) {
    const ssw_particle_t * p = ssw_load_particle(f);
    if (!p)
      break;
    mcpl_particle.pdgcode = p->pdgcode;
    if (!mcpl_particle.pdgcode) {
      printf("Warning: ignored particle with no PDG code set (raw ssw type was %li).\n",p->rawtype);
      continue;
    }

    mcpl_particle.position[0] = p->x;//already in cm
    mcpl_particle.position[1] = p->y;//already in cm
    mcpl_particle.position[2] = p->z;//already in cm
    mcpl_particle.direction[0] = p->dirx;
    mcpl_particle.direction[1] = p->diry;
    mcpl_particle.direction[2] = p->dirz;
    mcpl_particle.time = p->time * 1.0e-5;//"shakes" to milliseconds
    mcpl_particle.weight = p->weight;
    mcpl_particle.ekin = p->ekin;//already in MeV
    mcpl_particle.userflags = p->isurf;

    mcpl_add_particle(mcplfh,&mcpl_particle);

  }

  const char * tmp = mcpl_outfile_filename(mcplfh);
  size_t laf = strlen(tmp);
  char * actual_filename = malloc(laf+1);
  if (!actual_filename)
    ssw_error("memory allocation failure");
  actual_filename[0]='\0';
  ssw_strcat(actual_filename,tmp,laf+1);

  int did_gzip = 0;
  if (opt_gzip)
    did_gzip = mcpl_closeandgzip_outfile(mcplfh);
  else
    mcpl_close_outfile(mcplfh);
  ssw_close_file(f);

  printf("Created %s%s\n",actual_filename,(did_gzip?".gz":""));
  free(actual_filename);
  return 1;
}